

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_runtime.cpp
# Opt level: O2

void __thiscall MppRuntimeService::MppRuntimeService(MppRuntimeService *this)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  FILE *__stream;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  int iStack_150;
  int local_144;
  long local_140;
  char path [256];
  
  mpp_env_get_u32("mpp_rt_debug",&mpp_rt_debug,0);
  this->allocator_valid[0] = 1;
  iVar3 = access("/dev/ion",6);
  this->allocator_valid[1] = (uint)(iVar3 == 0);
  iVar3 = access("/dev/dri/renderD128",6);
  if (iVar3 == 0) {
    uVar4 = 1;
  }
  else {
    iVar3 = access("/dev/dri/card0",6);
    uVar4 = (uint)(iVar3 == 0);
  }
  this->allocator_valid[3] = uVar4;
  iVar3 = access("/dev/dma_heap",4);
  this->allocator_valid[4] = (uint)(iVar3 == 0);
  RVar1 = this->allocator_valid[1];
  RVar2 = this->allocator_valid[3];
  if (((iVar3 == 0) || (RVar1 != 0)) || (RVar2 != 0)) {
    if (iVar3 == 0) {
      if (mpp_rt_debug == 0) {
        return;
      }
      pcVar8 = "use dma heap allocator\n";
    }
    else if (RVar1 == 0 || RVar2 != 0) {
      if (RVar2 == 0 || RVar1 != 0) {
        iVar3 = access("/dev/mpp_service",6);
        if (iVar3 != 0) {
          if ((this->allocator_valid[1] != 0) && (this->allocator_valid[3] != 0)) {
            builtin_strncpy(path,"/proc/device-tree/",0x13);
            lVar7 = 0;
            while (lVar7 != 3) {
              iVar3 = (&_ZL13mpp_vpu_names_rel)[lVar7];
              local_140 = lVar7;
              for (lVar9 = 0; lVar9 != 0x1c; lVar9 = lVar9 + 4) {
                uVar4 = snprintf(path + 0x12,0xed,"%s%s",(long)&_ZL13mpp_vpu_names_rel + (long)iVar3
                                 ,(long)&_ZL15mpp_vpu_address_rel +
                                  (long)*(int *)((long)&_ZL15mpp_vpu_address_rel + lVar9));
                iVar5 = access(path,0);
                if (iVar5 == 0) {
                  snprintf(path + (ulong)uVar4 + 0x12,(ulong)(0xed - uVar4),"/%s","allocator");
                  iVar5 = access(path,0);
                  if (iVar5 == 0) {
                    local_144 = 0;
                    __stream = fopen(path,"rb");
                    if (__stream != (FILE *)0x0) {
                      sVar6 = fread(&local_144,1,4,__stream);
                      if (sVar6 == 4) {
                        if (local_144 != 0) {
                          this->allocator_valid[1] = 0;
                          if (mpp_rt_debug == 0) {
                            return;
                          }
                          pcVar8 = "found drm allocator in dts\n";
                          goto LAB_00167e81;
                        }
                      }
                      else {
                        _mpp_log_l(2,"mpp_rt","failed to read dts allocator value default 0\n",
                                   (char *)0x0);
                      }
                      this->allocator_valid[3] = 0;
                      if (mpp_rt_debug == 0) {
                        return;
                      }
                      pcVar8 = "found ion allocator in dts\n";
                      goto LAB_00167e81;
                    }
                  }
                }
              }
              lVar7 = local_140 + 1;
            }
            pcVar8 = "Can NOT found allocator in dts, enable both ion and drm\n";
LAB_00167e81:
            _mpp_log_l(4,"mpp_rt",pcVar8,(char *)0x0);
          }
          return;
        }
        this->allocator_valid[1] = 0;
        if (mpp_rt_debug == 0) {
          return;
        }
        pcVar8 = "use drm allocator for mpp_service\n";
      }
      else {
        if (mpp_rt_debug == 0) {
          return;
        }
        pcVar8 = "use drm allocator\n";
      }
    }
    else {
      if (mpp_rt_debug == 0) {
        return;
      }
      pcVar8 = "use ion allocator\n";
    }
    iStack_150 = 4;
  }
  else {
    pcVar8 = "can NOT found any allocator\n";
    iStack_150 = 2;
  }
  _mpp_log_l(iStack_150,"mpp_rt",pcVar8,(char *)0x0);
  return;
}

Assistant:

MppRuntimeService::MppRuntimeService()
{
    mpp_env_get_u32("mpp_rt_debug", &mpp_rt_debug, 0);

    allocator_valid[MPP_BUFFER_TYPE_NORMAL] = 1;
    allocator_valid[MPP_BUFFER_TYPE_ION] = !access("/dev/ion", F_OK | R_OK | W_OK);
    allocator_valid[MPP_BUFFER_TYPE_DRM] =
        !access("/dev/dri/renderD128", F_OK | R_OK | W_OK) ||
        !access("/dev/dri/card0", F_OK | R_OK | W_OK);
    allocator_valid[MPP_BUFFER_TYPE_DMA_HEAP] = !access("/dev/dma_heap", F_OK | R_OK);

    if (!allocator_valid[MPP_BUFFER_TYPE_ION] &&
        !allocator_valid[MPP_BUFFER_TYPE_DRM] &&
        !allocator_valid[MPP_BUFFER_TYPE_DMA_HEAP]) {
        mpp_err("can NOT found any allocator\n");
        return;
    }

    if (allocator_valid[MPP_BUFFER_TYPE_DMA_HEAP]) {
        mpp_rt_dbg("use dma heap allocator\n");
        return;
    }

    if (allocator_valid[MPP_BUFFER_TYPE_ION] && !allocator_valid[MPP_BUFFER_TYPE_DRM]) {
        mpp_rt_dbg("use ion allocator\n");
        return;
    }

    if (!allocator_valid[MPP_BUFFER_TYPE_ION] && allocator_valid[MPP_BUFFER_TYPE_DRM]) {
        mpp_rt_dbg("use drm allocator\n");
        return;
    }

    if (!access("/dev/mpp_service", F_OK | R_OK | W_OK)) {
        allocator_valid[MPP_BUFFER_TYPE_ION] = 0;

        mpp_rt_dbg("use drm allocator for mpp_service\n");
        return;
    }

    // If both ion and drm is enabled detect allocator in dts to choose one
    // TODO: When unify dma fd kernel is completed this part will be removed.
    if (allocator_valid[MPP_BUFFER_TYPE_ION] &&
        allocator_valid[MPP_BUFFER_TYPE_DRM]) {
        /* Detect hardware buffer type is ion or drm */
        RK_U32 i, j;
        char path[MAX_DTS_PATH_LEN];
        RK_U32 path_len = MAX_DTS_PATH_LEN - 1;
        RK_U32 dts_path_len = snprintf(path, path_len, "%s", mpp_dts_base);
        char *p = path + dts_path_len;
        RK_U32 allocator_found = 0;

        path_len -= dts_path_len;

        for (i = 0; i < MPP_ARRAY_ELEMS(mpp_vpu_names); i++) {
            for (j = 0; j < MPP_ARRAY_ELEMS(mpp_vpu_address); j++) {
                RK_U32 dev_path_len = snprintf(p, path_len, "%s%s",
                                               mpp_vpu_names[i], mpp_vpu_address[j]);
                int f_ok = access(path, F_OK);
                if (f_ok == 0) {
                    snprintf(p + dev_path_len, path_len - dev_path_len, "/%s", "allocator");
                    f_ok = access(path, F_OK);
                    if (f_ok == 0) {
                        RK_S32 val = 0;
                        FILE *fp = fopen(path, "rb");
                        if (fp) {
                            size_t len = fread(&val, 1, 4, fp);
                            // zero for ion non-zero for drm ->
                            // zero     - disable drm
                            // non-zero - disable ion
                            if (len != 4) {
                                mpp_err("failed to read dts allocator value default 0\n");
                                val = 0;
                            }

                            if (val == 0) {
                                allocator_valid[MPP_BUFFER_TYPE_DRM] = 0;
                                mpp_rt_dbg("found ion allocator in dts\n");
                            } else {
                                allocator_valid[MPP_BUFFER_TYPE_ION] = 0;
                                mpp_rt_dbg("found drm allocator in dts\n");
                            }
                            allocator_found = 1;
                        }
                    }
                }
                if (allocator_found)
                    break;
            }
            if (allocator_found)
                break;
        }

        if (!allocator_found)
            mpp_log("Can NOT found allocator in dts, enable both ion and drm\n");
    }
}